

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

int Lodtalk::Float::stNotEqual(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  double dVar3;
  Oop b;
  Oop a;
  anon_union_8_4_0eb573b0_for_Oop_0 local_28;
  double local_20;
  anon_union_8_4_0eb573b0_for_Oop_0 local_18;
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) != 1) {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar2;
  }
  local_18._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  local_18.uintValue._4_4_ = extraout_var_00;
  local_28._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  local_28.uintValue._4_4_ = extraout_var_01;
  bVar1 = Oop::isFloatOrInt((Oop *)&local_18);
  if ((bVar1) && (bVar1 = Oop::isFloatOrInt((Oop *)&local_28), bVar1)) {
    local_20 = Oop::decodeFloatOrInt((Oop *)&local_18);
    dVar3 = Oop::decodeFloatOrInt((Oop *)&local_28);
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x14])
                      (-(ulong)(dVar3 != local_20) & 0x3ff0000000000000,interpreter);
    return iVar2;
  }
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar2;
}

Assistant:

int Float::stNotEqual(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    auto a = interpreter->getReceiver();
    auto b = interpreter->getTemporary(0);
    if (!a.isFloatOrInt() || !b.isFloatOrInt())
        return interpreter->primitiveFailed();

    auto fa = a.decodeFloatOrInt();
    auto fb = b.decodeFloatOrInt();
    return interpreter->returnFloat(fa != fb);
}